

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ResultBuilder::captureExpectedException
          (ResultBuilder *this,
          Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *matcher)

{
  byte bVar1;
  long *in_RSI;
  AssertionResult *in_RDI;
  AssertionResult result;
  string actualMessage;
  AssertionResultData data;
  AssertionResultData *in_stack_fffffffffffffec0;
  AssertionInfo *in_stack_fffffffffffffec8;
  AssertionResult *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  ResultBuilder *in_stack_fffffffffffffee0;
  string local_88 [48];
  string local_58 [64];
  undefined4 local_18;
  long *local_10;
  
  local_10 = in_RSI;
  AssertionResultData::AssertionResultData
            ((AssertionResultData *)in_stack_fffffffffffffed0,
             (AssertionResultData *)in_stack_fffffffffffffec8);
  local_18 = 0;
  std::__cxx11::string::operator=(local_58,(string *)&(in_RDI->m_info).capturedExpression);
  translateActiveException_abi_cxx11_();
  bVar1 = (**(code **)(*local_10 + 0x28))(local_10,local_88);
  if ((bVar1 & 1) == 0) {
    local_18 = 0x11;
    std::__cxx11::string::operator=(local_58,local_88);
  }
  AssertionResult::AssertionResult
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  handleResult(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  AssertionResult::~AssertionResult(in_RDI);
  std::__cxx11::string::~string(local_88);
  AssertionResultData::~AssertionResultData((AssertionResultData *)in_RDI);
  return;
}

Assistant:

void ResultBuilder::captureExpectedException( Matchers::Impl::Matcher<std::string> const& matcher ) {

        assert( m_exprComponents.testFalse == false );
        AssertionResultData data = m_data;
        data.resultType = ResultWas::Ok;
        data.reconstructedExpression = m_assertionInfo.capturedExpression;

        std::string actualMessage = Catch::translateActiveException();
        if( !matcher.match( actualMessage ) ) {
            data.resultType = ResultWas::ExpressionFailed;
            data.reconstructedExpression = actualMessage;
        }
        AssertionResult result( m_assertionInfo, data );
        handleResult( result );
    }